

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int verify_finished(ptls_t *tls,ptls_iovec_t message)

{
  int iVar1;
  int iVar2;
  uint8_t verify_data [64];
  undefined1 auStack_58 [64];
  
  iVar1 = 0x32;
  if (tls->key_schedule->algo->digest_size + 4 == message.len) {
    iVar1 = calc_verify_data(auStack_58,tls->key_schedule,&tls->traffic_protection);
    if (iVar1 == 0) {
      iVar2 = bcmp(message.base + 4,auStack_58,tls->key_schedule->algo->digest_size);
      iVar1 = 0x28;
      if (iVar2 == 0) {
        iVar1 = 0;
      }
    }
  }
  (*ptls_clear_memory)(auStack_58,0x40);
  return iVar1;
}

Assistant:

static int verify_finished(ptls_t *tls, ptls_iovec_t message)
{
    uint8_t verify_data[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if (PTLS_HANDSHAKE_HEADER_SIZE + tls->key_schedule->algo->digest_size != message.len) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    if ((ret = calc_verify_data(verify_data, tls->key_schedule, tls->traffic_protection.dec.secret)) != 0)
        goto Exit;
    if (memcmp(message.base + PTLS_HANDSHAKE_HEADER_SIZE, verify_data, tls->key_schedule->algo->digest_size) != 0) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }

Exit:
    ptls_clear_memory(verify_data, sizeof(verify_data));
    return ret;
}